

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

int prvTidyDecodeUTF8BytesToChar
              (uint *c,uint firstByte,ctmbstr successorBytes,TidyInputSource *inp,int *count)

{
  int iVar1;
  bool bVar2;
  Bool BVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  byte bVar10;
  ctmbstr ptVar11;
  ulong uVar12;
  bool bVar13;
  byte tempbuf [10];
  tmbchar local_3a [10];
  
  ptVar11 = successorBytes;
  if (successorBytes == (ctmbstr)0x0) {
    ptVar11 = local_3a;
  }
  if (firstByte == 0xffffffff) {
    *c = 0xffffffff;
    *count = 1;
    return 0;
  }
  uVar12 = 1;
  bVar13 = false;
  if (firstByte < 0x80) {
    bVar2 = false;
    uVar8 = firstByte;
  }
  else {
    if ((firstByte & 0xe0) == 0xc0) {
      uVar8 = firstByte & 0x1f;
      uVar12 = 2;
    }
    else if ((firstByte & 0xf0) == 0xe0) {
      uVar8 = firstByte & 0xf;
      uVar12 = 3;
    }
    else {
      if ((firstByte & 0xf8) != 0xf0) {
        if ((firstByte & 0xfc) == 0xf8) {
          uVar8 = firstByte & 3;
          uVar12 = 5;
        }
        else {
          bVar13 = (firstByte & 0xfe) == 0xfc;
          uVar8 = firstByte & 1;
          if (!bVar13) {
            uVar8 = firstByte;
          }
          uVar12 = (ulong)((uint)bVar13 * 5 + 1);
        }
        bVar2 = true;
        bVar13 = true;
        goto LAB_0013708e;
      }
      uVar8 = firstByte & 7;
      uVar12 = 4;
    }
    bVar2 = true;
  }
LAB_0013708e:
  uVar6 = (uint)uVar12;
  if (successorBytes == (ctmbstr)0x0) {
    if (inp == (TidyInputSource *)0x0) {
      uVar6 = 1;
      bVar13 = bVar2;
    }
    else if (1 < uVar6) {
      lVar7 = 0;
      while( true ) {
        uVar6 = (uint)uVar12;
        BVar3 = (*inp->eof)(inp->sourceData);
        if (BVar3 != no) break;
        uVar4 = (*inp->getByte)(inp->sourceData);
        ptVar11[lVar7] = (byte)uVar4;
        if ((uVar4 & 0xc0) == 0x80) {
          uVar8 = uVar8 << 6 | uVar4 & 0x3f;
        }
        else {
          uVar12 = lVar7 + 1;
          if (uVar4 != 0xffffffff) {
            (*inp->ungetByte)(inp->sourceData,(byte)uVar4);
          }
          bVar13 = true;
        }
        uVar6 = (uint)uVar12;
        if (((uVar4 & 0xc0) != 0x80) || (lVar7 = lVar7 + 1, (int)(uVar6 - 1) <= lVar7)) break;
      }
    }
  }
  else if (1 < uVar6) {
    uVar12 = 0;
    do {
      bVar10 = ptVar11[uVar12];
      if ((bVar10 == 0) || ((bVar10 & 0xffffffc0) != 0x80)) {
        uVar6 = (int)uVar12 + 1;
        bVar13 = true;
        break;
      }
      uVar8 = bVar10 & 0x3f | uVar8 << 6;
      uVar12 = uVar12 + 1;
    } while (uVar6 - 1 != uVar12);
  }
  iVar5 = -1;
  if (((!bVar13) && ((uVar8 & 0xfffffffe) != 0xfffe)) && (uVar8 < 0x110000)) {
    lVar7 = (long)*(int *)(&DAT_00158e2c + (long)(int)uVar6 * 4);
    if (validUTF8[lVar7].lowChar <= uVar8) {
      iVar1 = offsetUTF8Sequences[(int)uVar6];
      if ((uVar8 <= (uint)offsetUTF8Sequences[(long)iVar1 * 5 + 4]) &&
         (*(int *)(&DAT_00158e2c + (long)(int)uVar6 * 4) < iVar1)) {
        ptVar11 = local_3a;
        if (successorBytes != (ctmbstr)0x0) {
          ptVar11 = successorBytes;
        }
        lVar9 = lVar7 * 0x14 + 0x158e5d;
        bVar13 = true;
        do {
          if (0 < (int)uVar6) {
            uVar12 = 0;
            do {
              bVar10 = (byte)firstByte;
              if (uVar12 != 0) {
                bVar10 = ptVar11[uVar12 - 1];
              }
              if ((*(byte *)(lVar9 + -1 + uVar12 * 2) <= bVar10) &&
                 (bVar10 <= *(byte *)(lVar9 + uVar12 * 2))) {
                bVar13 = false;
              }
              if (bVar13) {
                bVar13 = true;
                break;
              }
              uVar12 = uVar12 + 1;
              bVar13 = false;
            } while (uVar6 != uVar12);
          }
          lVar7 = lVar7 + 1;
          lVar9 = lVar9 + 0x14;
        } while (lVar7 != iVar1);
        iVar5 = -(uint)bVar13;
      }
    }
  }
  *count = uVar6;
  *c = uVar8;
  return iVar5;
}

Assistant:

int TY_(DecodeUTF8BytesToChar)( uint* c, uint firstByte, ctmbstr successorBytes,
                                TidyInputSource* inp, int* count )
{
    byte tempbuf[10];
    byte *buf = &tempbuf[0];
    uint ch = 0, n = 0;
    int i, bytes = 0;
    Bool hasError = no;
    
    if ( successorBytes )
        buf = (byte*) successorBytes;
        
    /* special check if we have been passed an EOF char */
    if ( firstByte == EndOfStream )
    {
        /* at present */
        *c = firstByte;
        *count = 1;
        return 0;
    }

    ch = firstByte; /* first byte is passed in separately */
    
    if (ch <= 0x7F) /* 0XXX XXXX one byte */
    {
        n = ch;
        bytes = 1;
    }
    else if ((ch & 0xE0) == 0xC0)  /* 110X XXXX  two bytes */
    {
        n = ch & 31;
        bytes = 2;
    }
    else if ((ch & 0xF0) == 0xE0)  /* 1110 XXXX  three bytes */
    {
        n = ch & 15;
        bytes = 3;
    }
    else if ((ch & 0xF8) == 0xF0)  /* 1111 0XXX  four bytes */
    {
        n = ch & 7;
        bytes = 4;
    }
    else if ((ch & 0xFC) == 0xF8)  /* 1111 10XX  five bytes */
    {
        n = ch & 3;
        bytes = 5;
        hasError = yes;
    }
    else if ((ch & 0xFE) == 0xFC)  /* 1111 110X  six bytes */
    {
        n = ch & 1;
        bytes = 6;
        hasError = yes;
    }
    else
    {
        /* not a valid first byte of a UTF-8 sequence */
        n = ch;
        bytes = 1;
        hasError = yes;
    }

    /* successor bytes should have the form 10XX XXXX */

    /* If caller supplied buffer, use it.  Else see if caller
    ** supplied an input source, use that.
    */
    if ( successorBytes )
    {
        for ( i=0; i < bytes-1; ++i )
        {
            if ( !buf[i] || (buf[i] & 0xC0) != 0x80 )
            {
                hasError = yes;
                bytes = i+1;
                break;
            }
            n = (n << 6) | (buf[i] & 0x3F);
        }
    }
    else if ( inp )
    {
        for ( i=0; i < bytes-1 && !inp->eof(inp->sourceData); ++i )
        {
            int b = inp->getByte( inp->sourceData );
            buf[i] = (tmbchar) b;

            /* End of data or illegal successor byte value */
            if ( b == EOF || (buf[i] & 0xC0) != 0x80 )
            {
                hasError = yes;
                bytes = i+1;
                if ( b != EOF )
                    inp->ungetByte( inp->sourceData, buf[i] );
                break;
            }
            n = (n << 6) | (buf[i] & 0x3F);
        }
    }
    else if ( bytes > 1 )
    {
        hasError = yes;
        bytes = 1;
    }
    
    if (!hasError && ((n == kUTF8ByteSwapNotAChar) || (n == kUTF8NotAChar)))
        hasError = yes;
        
    if (!hasError && (n > kMaxUTF8FromUCS4))
        hasError = yes;

    if (!hasError)
    {
        int lo, hi;
        
        lo = offsetUTF8Sequences[bytes - 1];
        hi = offsetUTF8Sequences[bytes] - 1;
        
        /* check for overlong sequences */
        if ((n < validUTF8[lo].lowChar) || (n > validUTF8[hi].highChar))
            hasError = yes;
        else
        {
            hasError = yes; /* assume error until proven otherwise */
        
            for (i = lo; i <= hi; i++)
            {
                int tempCount;
                byte theByte;
                
                for (tempCount = 0; tempCount < bytes; tempCount++)
                {
                    if (!tempCount)
                        theByte = (tmbchar) firstByte;
                    else
                        theByte = buf[tempCount - 1];
                        
                    if ( theByte >= validUTF8[i].validBytes[(tempCount * 2)] &&
                         theByte <= validUTF8[i].validBytes[(tempCount * 2) + 1] )
                        hasError = no;
                    if (hasError)
                        break;
                }
            }
        }
    }

#if 1 && defined(_DEBUG)
    if ( hasError )
    {
       /* debug */
       fprintf( stderr, "UTF-8 decoding error of %d bytes : ", bytes );
       fprintf( stderr, "0x%02x ", firstByte );
       for (i = 1; i < bytes; i++)
           fprintf( stderr, "0x%02x ", buf[i - 1] );
       fprintf( stderr, " = U+%04X\n", n );
    }
#endif

    *count = bytes;
    *c = n;
    if ( hasError )
        return -1;
    return 0;
}